

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall
ON_BinaryFile::Internal_SeekFromCurrentPositionOverride(ON_BinaryFile *this,int offset)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  
  if (this->m_fp == (FILE *)0x0) {
    bVar3 = false;
  }
  else if (((this->m_memory_buffer == (uchar *)0x0) ||
           (uVar2 = this->m_memory_buffer_ptr + (long)offset, (long)uVar2 < 0)) ||
          (this->m_memory_buffer_size < uVar2)) {
    (*(this->super_ON_BinaryArchive)._vptr_ON_BinaryArchive[8])(this);
    bVar1 = ON_FileStream::SeekFromCurrentPosition(this->m_fp,(long)offset);
    bVar3 = true;
    if (!bVar1) {
      bVar3 = false;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x42ad,"","ON_FileStream::SeekFromCurrentPosition(m_fp,offset) failed.");
    }
  }
  else {
    this->m_memory_buffer_ptr = uVar2;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool ON_BinaryFile::Internal_SeekFromCurrentPositionOverride( int offset )
{
  // it appears that the calls to SeekFromCurrentPosition(),
  // and consequent call to fseek(), in ON_BinaryArchive::EndWrite3DMChunk()
  // really slow down 3DM file writing on some networks.  There are
  // reports of a 100x difference in local vs network saves.
  // I could not reproduce these 100x slow saves in testing on McNeel's
  // network but we have a good quality network and a server that's
  // properly tuned.  My guess is that the slow saves are happening
  // on servers that do a poor job of cacheing because they are starved
  // for memory and/or heavily used at the time of the save.
  //
  // To speed up network saves, ON_BinaryFile can optionally use
  // it's own buffer for buffered I/O instead of relying on fwrite()
  // and the OS to handle this.
  bool rc = false;
  if ( m_fp ) 
  {
    if ( nullptr != m_memory_buffer
      && ((ON__INT_PTR)m_memory_buffer_ptr)+((ON__INT_PTR)offset) >= 0
      && m_memory_buffer_ptr+offset <= m_memory_buffer_size ) 
    {
      m_memory_buffer_ptr += offset;
      rc = true;
    }
    else
    {
      // don't deal with memory buffer I/O if seek lands outside of current memory buffer.
      Flush();      
      if ( ON_FileStream::SeekFromCurrentPosition(m_fp,offset) )
      {
        rc = true;
      }
      else 
      {
        ON_ERROR("ON_FileStream::SeekFromCurrentPosition(m_fp,offset) failed.");
      }
    }
  }
  return rc;
}